

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_mem.c
# Opt level: O0

BIO * BIO_new_mem_buf(void *buf,int len)

{
  bio_st *pbVar1;
  _func_603 *p_Var2;
  _func_595 *p_Var3;
  BIO_METHOD *pBVar4;
  size_t sz;
  BIO_BUF_MEM *bb;
  BUF_MEM *b;
  BIO *ret;
  char *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  int line;
  char *in_stack_ffffffffffffffd0;
  BIO *local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (buf == (void *)0x0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffd0,line,in_stack_ffffffffffffffc0);
    ERR_set_error(0x20,0xc0102,(char *)0x0);
    local_8 = (BIO *)0x0;
  }
  else {
    if (len < 0) {
      p_Var3 = (_func_595 *)strlen((char *)buf);
    }
    else {
      p_Var3 = (_func_595 *)(long)len;
    }
    pBVar4 = BIO_s_mem();
    local_8 = BIO_new(pBVar4);
    if (local_8 == (BIO *)0x0) {
      local_8 = (BIO *)0x0;
    }
    else {
      pbVar1 = local_8->prev_bio;
      pBVar4 = pbVar1->method;
      pBVar4->name = (char *)buf;
      *(_func_595 **)pBVar4 = p_Var3;
      pBVar4->bwrite = p_Var3;
      p_Var2 = pbVar1->callback;
      pBVar4 = pbVar1->method;
      *(undefined8 *)p_Var2 = *(undefined8 *)pBVar4;
      *(char **)(p_Var2 + 8) = pBVar4->name;
      *(_func_595 **)(p_Var2 + 0x10) = pBVar4->bwrite;
      *(_func_596 **)(p_Var2 + 0x18) = pBVar4->bread;
      *(uint *)&local_8->ptr = *(uint *)&local_8->ptr | 0x200;
      *(undefined4 *)&local_8->next_bio = 0;
    }
  }
  return local_8;
}

Assistant:

BIO *BIO_new_mem_buf(const void *buf, int len)
{
    BIO *ret;
    BUF_MEM *b;
    BIO_BUF_MEM *bb;
    size_t sz;

    if (buf == NULL) {
        ERR_raise(ERR_LIB_BIO, ERR_R_PASSED_NULL_PARAMETER);
        return NULL;
    }
    sz = (len < 0) ? strlen(buf) : (size_t)len;
    if ((ret = BIO_new(BIO_s_mem())) == NULL)
        return NULL;
    bb = (BIO_BUF_MEM *)ret->ptr;
    b = bb->buf;
    /* Cast away const and trust in the MEM_RDONLY flag. */
    b->data = (void *)buf;
    b->length = sz;
    b->max = sz;
    *bb->readp = *bb->buf;
    ret->flags |= BIO_FLAGS_MEM_RDONLY;
    /* Since this is static data retrying won't help */
    ret->num = 0;
    return ret;
}